

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall PhPacker_Arg_I_Test::TestBody(PhPacker_Arg_I_Test *this)

{
  uint uVar1;
  uint *puVar2;
  char *pcVar3;
  uint32_t result;
  uint32_t expected;
  string str;
  uint32_t res;
  string s;
  AssertHelper local_90;
  undefined1 local_88 [8];
  _Storage local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  AssertHelper local_68;
  uint local_60 [2];
  undefined1 local_58 [8];
  _Storage local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint local_34;
  string local_30;
  
  PhPacker::pack<unsigned_int,_0>(&local_30,'I',0x7b);
  PhPacker::unpack((PhPacker *)local_58,'I',&local_30);
  puVar2 = (uint *)std::__any_caster<unsigned_int>((any *)local_58);
  if (puVar2 == (uint *)0x0) {
    std::__throw_bad_any_cast();
  }
  uVar1 = *puVar2;
  if ((code *)CONCAT71(local_58._1_7_,local_58[0]) != (code *)0x0) {
    (*(code *)CONCAT71(local_58._1_7_,local_58[0]))(3,local_58,0);
  }
  local_88._0_4_ = 0x7b;
  local_34 = uVar1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_58,"res","123",&local_34,(int *)local_88);
  if (local_58[0] == (PhPacker)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_50._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT44(local_88._4_4_,local_88._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88._4_4_,local_88._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_58 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50._M_ptr);
  }
  PhPacker::pack<unsigned_int,_0>((string *)local_58,'I',0x270fddc2);
  PhPacker::unpack((PhPacker *)local_88,'I',(string *)local_58);
  puVar2 = (uint *)std::__any_caster<unsigned_int>((any *)local_88);
  if (puVar2 == (uint *)0x0) {
    std::__throw_bad_any_cast();
  }
  uVar1 = *puVar2;
  if ((code *)CONCAT44(local_88._4_4_,local_88._0_4_) != (code *)0x0) {
    (*(code *)CONCAT44(local_88._4_4_,local_88._0_4_))(3,local_88,0);
  }
  local_60[1] = 0x270fddc2;
  local_60[0] = uVar1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_88,"result","expected",local_60,local_60 + 1);
  if (local_88[0] == (PhPacker)0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_80._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_80._M_ptr);
    }
    PhPacker::pack<unsigned_int,_0>((string *)local_88,'I',0xffffffff);
    std::__cxx11::string::operator=((string *)local_58,(string *)local_88);
    if ((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_) != local_88 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_),
                      local_78._M_allocated_capacity + 1);
    }
    PhPacker::unpack((PhPacker *)local_88,'I',(string *)local_58);
    puVar2 = (uint *)std::__any_caster<unsigned_int>((any *)local_88);
    if (puVar2 == (uint *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_60[0] = *puVar2;
    if ((code *)CONCAT44(local_88._4_4_,local_88._0_4_) != (code *)0x0) {
      (*(code *)CONCAT44(local_88._4_4_,local_88._0_4_))(3,local_88,0);
    }
    local_60[1] = 0xffffffff;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)local_88,"result","expected",local_60,local_60 + 1);
    if (local_88[0] == (PhPacker)0x0) {
      testing::Message::Message((Message *)&local_90);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *local_80._M_ptr;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x80,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_88 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_80._M_ptr);
      }
      PhPacker::pack<unsigned_int,_0>((string *)local_88,'I',0);
      std::__cxx11::string::operator=((string *)local_58,(string *)local_88);
      if ((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_) != local_88 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_),
                        local_78._M_allocated_capacity + 1);
      }
      PhPacker::unpack((PhPacker *)local_88,'I',(string *)local_58);
      puVar2 = (uint *)std::__any_caster<unsigned_int>((any *)local_88);
      if (puVar2 == (uint *)0x0) {
        std::__throw_bad_any_cast();
      }
      local_60[0] = *puVar2;
      if ((code *)CONCAT44(local_88._4_4_,local_88._0_4_) != (code *)0x0) {
        (*(code *)CONCAT44(local_88._4_4_,local_88._0_4_))(3,local_88,0);
      }
      local_60[1] = 0;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)local_88,"result","expected",local_60,local_60 + 1);
      if (local_88[0] != (PhPacker)0x0) goto LAB_0010d93f;
      testing::Message::Message((Message *)&local_90);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *local_80._M_ptr;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x85,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_90);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if (local_90.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_90.data_ + 8))();
  }
LAB_0010d93f:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_80._M_ptr);
  }
  if ((undefined1 *)CONCAT71(local_58._1_7_,local_58[0]) != local_58 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_58._1_7_,local_58[0]),
                    local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PhPacker, Arg_I)
{
   auto s = PhPacker::pack('I', 123u);
   uint32_t res = std::any_cast<uint32_t>(PhPacker::unpack('I', s));
   EXPECT_EQ(res, 123);

   std::string str = PhPacker::pack('I', 655351234u);
   uint32_t result = std::any_cast<uint32_t>(PhPacker::unpack('I', str));
   uint32_t expected = 655351234u;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('I', std::numeric_limits<uint32_t>::max());
   result = std::any_cast<uint32_t>(PhPacker::unpack('I', str));
   expected = std::numeric_limits<uint32_t>::max();
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('I', std::numeric_limits<uint32_t>::min());
   result = std::any_cast<uint32_t>(PhPacker::unpack('I', str));
   expected = std::numeric_limits<uint32_t>::min();
   GTEST_ASSERT_EQ(result, expected);
}